

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * anon_unknown.dwarf_90803::expandEnum(QString *value,QString *prefix)

{
  long lVar1;
  ulong uVar2;
  QString *pQVar3;
  QStringBuilder<const_QString_&,_QLatin1String> *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView s;
  qsizetype pos;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString_&>
  *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QString::startsWith(in_RSI,(CaseSensitivity)in_RDX);
  if ((uVar2 & 1) == 0) {
    s = Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_RSI,(size_t)in_stack_ffffffffffffff60);
    pQVar3 = (QString *)
             QString::lastIndexOf
                       (in_RSI,s,(CaseSensitivity)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (pQVar3 == (QString *)0xffffffffffffffff) {
      Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)in_RDX);
      ::operator+((QString *)in_RDX,(QLatin1String *)in_stack_ffffffffffffff58);
      ::operator+(in_RDX,(QString *)in_stack_ffffffffffffff58);
      ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff58);
    }
    else {
      QString::replace((longlong)in_RSI,0,pQVar3);
      QString::QString(in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
    }
  }
  else {
    QString::QString(in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString expandEnum(QString value, const QString &prefix)
    {
        if (value.startsWith(prefix))
            return value;
        const auto pos = value.lastIndexOf("::"_L1);
        if (pos == -1)
            return prefix + "::"_L1 + value;
        value.replace(0, pos, prefix);
        return value;
    }